

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void PPrintXmlDecl(TidyDocImpl *doc,uint indent,Node *node)

{
  TidyPrintImpl *pprint;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  AttVal *pAVar4;
  
  pprint = &doc->pprint;
  uVar1 = (doc->pprint).linelen;
  uVar3 = (doc->config).value[0x5d].v;
  if (uVar1 + indent < uVar3) {
    if ((doc->pprint).indent[0].spaces < 0) {
      (doc->pprint).indent[0].spaces = indent;
    }
    (doc->pprint).wraphere = uVar1;
  }
  else if ((doc->pprint).ixInd == 0) {
    (doc->pprint).indent[1].spaces = indent;
    (doc->pprint).ixInd = 1;
  }
  prvTidySetOptionInt(doc,TidyWrapLen,0xffffffff);
  uVar2 = *(uint *)((doc->config).value + 0x54);
  prvTidySetOptionInt(doc,TidyUpperCaseAttrs,0);
  AddString(pprint,"<?xml");
  pAVar4 = prvTidyAttrGetById(node,TidyAttr_VERSION);
  if (pAVar4 != (AttVal *)0x0) {
    PPrintAttribute(doc,indent,node,pAVar4);
  }
  pAVar4 = prvTidyAttrGetById(node,TidyAttr_ENCODING);
  if (pAVar4 != (AttVal *)0x0) {
    PPrintAttribute(doc,indent,node,pAVar4);
  }
  pAVar4 = prvTidyGetAttrByName(node,"standalone");
  if (pAVar4 != (AttVal *)0x0) {
    PPrintAttribute(doc,indent,node,pAVar4);
  }
  prvTidySetOptionInt(doc,TidyUpperCaseAttrs,(ulong)uVar2);
  if ((node->end == 0) || (doc->lexer->lexbuf[node->end - 1] != '?')) {
    AddChar(pprint,0x3f);
  }
  AddChar(pprint,0x3e);
  prvTidySetOptionInt(doc,TidyWrapLen,uVar3 & 0xffffffff);
  PFlushLineSmart(doc,indent);
  return;
}

Assistant:

static void PPrintXmlDecl( TidyDocImpl* doc, uint indent, Node *node )
{
    AttVal* att;
    uint saveWrap;
    TidyPrintImpl* pprint = &doc->pprint;
    Bool ucAttrs;
    SetWrap( doc, indent );
    saveWrap = WrapOff( doc );

    /* no case translation for XML declaration pseudo attributes */
    ucAttrs = cfg(doc, TidyUpperCaseAttrs);
    TY_(SetOptionInt)(doc, TidyUpperCaseAttrs, no);

    AddString( pprint, "<?xml" );

    /* Force order of XML declaration attributes */
    /* PPrintAttrs( doc, indent, node ); */
    if ( NULL != (att = TY_(AttrGetById)(node, TidyAttr_VERSION)) )
      PPrintAttribute( doc, indent, node, att );
    if ( NULL != (att = TY_(AttrGetById)(node, TidyAttr_ENCODING)) )
      PPrintAttribute( doc, indent, node, att );
    if ( NULL != (att = TY_(GetAttrByName)(node, "standalone")) )
      PPrintAttribute( doc, indent, node, att );

    /* restore old config value */
    TY_(SetOptionInt)(doc, TidyUpperCaseAttrs, ucAttrs);

    if ( node->end <= 0 || doc->lexer->lexbuf[node->end - 1] != '?' )
        AddChar( pprint, '?' );
    AddChar( pprint, '>' );
    WrapOn( doc, saveWrap );
    PFlushLineSmart( doc, indent );
}